

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

double __thiscall ON_SubDVertex::VertexSharpness(ON_SubDVertex *this)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  uint sharp_edge_count;
  ON_SubDEdge *this_00;
  unsigned_short vei;
  ulong uVar3;
  double dVar4;
  double local_30;
  
  if (((this->m_vertex_tag < 5) && ((0x16U >> (this->m_vertex_tag & 0x1f) & 1) != 0)) &&
     (pOVar2 = this->m_edges, pOVar2 != (ON_SubDEdgePtr *)0x0)) {
    uVar1 = this->m_edge_count;
    local_30 = 0.0;
    sharp_edge_count = 0;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      this_00 = (ON_SubDEdge *)(pOVar2[uVar3].m_ptr & 0xfffffffffffffff8);
      if (this_00 != (ON_SubDEdge *)0x0) {
        dVar4 = ON_SubDEdge::EndSharpness(this_00,this);
        if (0.0 < dVar4) {
          if (dVar4 <= local_30) {
            dVar4 = local_30;
          }
          sharp_edge_count = sharp_edge_count + 1;
          local_30 = dVar4;
        }
      }
    }
    dVar4 = Internal_VertexSharpnessCalculationHelper(this,sharp_edge_count,local_30);
    return dVar4;
  }
  return 0.0;
}

Assistant:

bool ON_SubDVertex::IsSmoothOrDartOrCrease() const
{
  return (ON_SubDVertexTag::Smooth == m_vertex_tag || ON_SubDVertexTag::Dart == m_vertex_tag || ON_SubDVertexTag::Crease == m_vertex_tag);
}